

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O0

size_t inform_dist_dump(inform_dist *dist,double *probs,size_t n)

{
  size_t sVar1;
  double dVar2;
  ulong local_30;
  size_t i;
  size_t n_local;
  double *probs_local;
  inform_dist *dist_local;
  
  if ((dist == (inform_dist *)0x0) || (dist->size == 0)) {
    dist_local = (inform_dist *)0x0;
  }
  else if (probs == (double *)0x0) {
    dist_local = (inform_dist *)0x0;
  }
  else if (n == dist->size) {
    local_30 = 0;
    while( true ) {
      sVar1 = inform_dist_size(dist);
      if (sVar1 <= local_30) break;
      dVar2 = inform_dist_unsafe_prob(dist,local_30);
      probs[local_30] = dVar2;
      local_30 = local_30 + 1;
    }
    dist_local = (inform_dist *)(long)(int)n;
  }
  else {
    dist_local = (inform_dist *)0x0;
  }
  return (size_t)dist_local;
}

Assistant:

size_t inform_dist_dump(inform_dist const *dist, double *probs, size_t n)
{
    // if the distribution is NULL or the event is outsize of the support
    if (dist == NULL || dist->size == 0)
    {
        return 0;
    }
    if (probs == NULL)
    {
        return 0;
    }
    if (n != dist->size)
    {
        return 0;
    }
    // loop over the events
    for (size_t i = 0; i < inform_dist_size(dist); ++i)
    {
        // store their probabilities in the array
        probs[i] = inform_dist_unsafe_prob(dist,i);
    }
    return (int) n;
}